

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O0

char * password_hash(char *password,char *algo,char *salt,int cost)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  size_t sStack_78;
  int len;
  size_t salt_len;
  size_t format_len;
  size_t salt_required_len;
  size_t output_len;
  char format [10];
  char *output;
  char *hash;
  char *gensalt;
  int cost_local;
  char *salt_local;
  char *algo_local;
  char *password_local;
  
  format[2] = '\0';
  format[3] = '\0';
  format[4] = '\0';
  format[5] = '\0';
  format[6] = '\0';
  format[7] = '\0';
  format[8] = '\0';
  format[9] = '\0';
  if (password == (char *)0x0) {
    if (-1 < msgno) {
      fprintf(_stderr,"password_hash: missing password\n");
    }
    password_local = (char *)0x0;
  }
  else if ((cost < 4) || (0x1f < cost)) {
    if (-1 < msgno) {
      fprintf(_stderr,"password_hash: invalid bcrypt cost parameter specified: %d\n",
              (ulong)(uint)cost);
    }
    password_local = (char *)0x0;
  }
  else {
    if (salt == (char *)0x0) {
      hash = make_salt(0x16);
      if (hash == (char *)0x0) {
        if ((0 < msgno) && (-1 < msgno)) {
          fprintf(_stderr,"password_hash: generated salt\n");
        }
        return (char *)0x0;
      }
      sStack_78 = strlen(hash);
    }
    else {
      sStack_78 = strlen(salt);
      hash = (char *)malloc(sStack_78 + 1);
      if (hash == (char *)0x0) {
        if ((0 < msgno) && (-1 < msgno)) {
          fprintf(_stderr,"password_hash: memory allocate\n");
        }
        return (char *)0x0;
      }
      memcpy(hash,salt,sStack_78);
      hash[sStack_78] = '\0';
      if (sStack_78 < 0x16) {
        free(hash);
        if ((0 < msgno) && (-1 < msgno)) {
          fprintf(_stderr,"password_hash: provided salt is too short: %ld expecting %ld\n",sStack_78
                  ,0x16);
        }
        return (char *)0x0;
      }
      iVar1 = is_alphabet(hash,sStack_78);
      if (iVar1 < 0) {
        iVar1 = to_base64(hash,sStack_78,sStack_78);
        if (iVar1 < 0) {
          free(hash);
          if ((0 < msgno) && (-1 < msgno)) {
            fprintf(_stderr,"password_hash: provided salt is not alphabet\n");
          }
          return (char *)0x0;
        }
        hash[iVar1] = '\0';
        sStack_78 = strlen(hash);
      }
    }
    if ((0 < msgno) && (-1 < msgno)) {
      fprintf(_stderr,
              "password_hash: parameters\n  password  => %s\n  algorithm => %s\n  salt      => %s\n  cost      => %d\n"
              ,password,algo,hash,(ulong)(uint)cost);
    }
    memset((void *)((long)&output_len + 6),0,10);
    sprintf((char *)((long)&output_len + 6),"$2y$%02d$",(ulong)(uint)cost);
    sVar2 = strlen((char *)((long)&output_len + 6));
    __s = (char *)malloc(sVar2 + sStack_78 + 1);
    if (__s == (char *)0x0) {
      if ((0 < msgno) && (-1 < msgno)) {
        fprintf(_stderr,"password_hash: memory allocate\n");
      }
      free(hash);
      password_local = (char *)0x0;
    }
    else {
      sprintf(__s,"%s%s",(long)&output_len + 6,hash);
      __s[sVar2 + sStack_78] = '\0';
      free(hash);
      if ((1 < msgno) && (-1 < msgno)) {
        fprintf(_stderr,"password_hash: hash => %s\n",__s);
      }
      format._2_8_ = malloc(0x3d);
      if ((void *)format._2_8_ == (void *)0x0) {
        free(__s);
        if ((0 < msgno) && (-1 < msgno)) {
          fprintf(_stderr,"password_hash: memory allocate\n");
        }
        password_local = (char *)0x0;
      }
      else {
        memset((void *)format._2_8_,0,0x3d);
        pcVar3 = _crypt_blowfish_rn(password,__s,(char *)format._2_8_,0x3d);
        if (pcVar3 == (char *)0x0) {
          free(__s);
          free((void *)format._2_8_);
          if ((0 < msgno) && (-1 < msgno)) {
            fprintf(_stderr,"password_hash: blowfish run.\n");
          }
          password_local = (char *)0x0;
        }
        else {
          free(__s);
          sVar2 = strlen((char *)format._2_8_);
          if (sVar2 < 0xe) {
            free((void *)format._2_8_);
            if ((0 < msgno) && (-1 < msgno)) {
              fprintf(_stderr,"password_hash: hash length.\n");
            }
            password_local = (char *)0x0;
          }
          else {
            password_local = (char *)format._2_8_;
          }
        }
      }
    }
  }
  return password_local;
}

Assistant:

char *
password_hash(const char *password, const char *algo,
              const char *salt, const int cost)
{
    char *gensalt = NULL, *hash = NULL, *output = NULL;
    char format[FORMAT_LEN];
    size_t output_len = BLOWFISH_LEN + 1;
    size_t salt_required_len = BCRYPT_BLOWFISH_SALT_REQUIRED_LEN;
    size_t format_len, salt_len;

    if (!password) {
        msg_error(hash, "missing password\n");
        return NULL;
    }

    if (cost < 4 || cost > 31) {
        msg_error(hash, "invalid bcrypt cost parameter specified: %d\n", cost);
        return NULL;
    }

    if (salt) {
        salt_len = strlen(salt);
        gensalt = (char *)malloc(salt_len + 1);
        if (!gensalt) {
            msg_verbose(hash, "memory allocate\n");
            return NULL;
        }
        memcpy(gensalt, salt, salt_len);
        gensalt[salt_len] = 0;

        if (salt_len < salt_required_len) {
            free(gensalt);
            msg_verbose(hash, "provided salt is too short: %ld expecting %ld\n",
                        salt_len, salt_required_len);
            return NULL;
        } else if (is_alphabet(gensalt, salt_len) < 0) {
            int len = to_base64(gensalt, salt_len, salt_len);
            if (len < 0) {
                free(gensalt);
                msg_verbose(hash, "provided salt is not alphabet\n");
                return NULL;
            }
            gensalt[len] = 0;
            salt_len = strlen(gensalt);
        }
    } else {
        gensalt = make_salt(salt_required_len);
        if (!gensalt) {
            msg_verbose(hash, "generated salt\n");
            return NULL;
        }
        salt_len = strlen(gensalt);
    }

    msg_verbose(hash,"parameters\n"
                "  password  => %s\n"
                "  algorithm => %s\n"
                "  salt      => %s\n"
                "  cost      => %d\n",
                password, algo, gensalt, cost);

    memset(format, 0, sizeof(format));
    sprintf(format, "$2y$%02d$", cost);
    format_len = strlen(format);

    hash = malloc(format_len + salt_len + 1);
    if (!hash) {
        msg_verbose(hash, "memory allocate\n");
        free(gensalt);
        return NULL;
    }

    sprintf(hash, "%s%s", format, gensalt);
    hash[format_len + salt_len] = 0;

    free(gensalt);

    msg_verbose_ex(hash, 2, "hash => %s\n", hash);

    output = malloc(output_len);
    if (!output) {
        free(hash);
        msg_verbose(hash, "memory allocate\n");
        return NULL;
    }

    memset(output, 0, output_len);

    if (_crypt_blowfish_rn(password, hash, output, output_len) == NULL) {
        free(hash);
        free(output);
        msg_verbose(hash, "blowfish run.\n");
        return NULL;
    }

    free(hash);

    if (strlen(output) <= 13) {
        free(output);
        msg_verbose(hash, "hash length.\n");
        return NULL;
    }

    return output;
}